

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O2

void __thiscall
slang::SourceSnippet::highlightRange
          (SourceSnippet *this,SourceRange range,SourceLocation caretLoc,size_t col,
          string_view sourceLine)

{
  pointer pcVar1;
  undefined8 in_RAX;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  undefined8 uStack_28;
  
  uVar5 = (ulong)range.startLoc >> 0x1c;
  uVar4 = (ulong)range.endLoc >> 0x1c;
  uVar2 = (((ulong)caretLoc >> 0x1c) - col) + 1;
  if (uVar5 <= uVar2) {
    uVar5 = uVar2;
  }
  uVar7 = sourceLine._M_len + uVar2;
  if (uVar4 < sourceLine._M_len + uVar2) {
    uVar7 = uVar4;
  }
  if (uVar7 <= uVar5) {
    return;
  }
  sVar8 = uVar7 - uVar2;
  uVar2 = ~((ulong)caretLoc >> 0x1c);
  while ((sourceLine._M_str[uVar5 + uVar2 + col] == '\t' ||
         (sourceLine._M_str[uVar5 + uVar2 + col] == ' '))) {
    uVar5 = uVar5 + 1;
    if (uVar5 == uVar7) {
      return;
    }
  }
  lVar6 = uVar5 - uVar7;
  while ((sourceLine._M_str[sVar8 - 1] == ' ' || (sourceLine._M_str[sVar8 - 1] == '\t'))) {
    sVar8 = sVar8 - 1;
    lVar6 = lVar6 + 1;
    if (lVar6 == 0) {
      return;
    }
  }
  uStack_28 = in_RAX;
  sVar3 = getColumnForByte(this,uVar2 + col + uVar5);
  sVar8 = getColumnForByte(this,sVar8);
  if ((this->highlightLine)._M_string_length < sVar8) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (&this->highlightLine,sVar8,' ');
  }
  pcVar1 = (this->highlightLine)._M_dataplus._M_p;
  uStack_28 = CONCAT17(0x7e,(undefined7)uStack_28);
  std::ranges::__fill_fn::
  operator()<char,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ((__fill_fn *)&std::ranges::fill,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(pcVar1 + sVar3),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(pcVar1 + sVar8),(char *)((long)&uStack_28 + 7));
  return;
}

Assistant:

void highlightRange(SourceRange range, SourceLocation caretLoc, size_t col,
                        std::string_view sourceLine) {
        // Trim the range so that it only falls on the same line as the cursor
        size_t start = range.start().offset();
        size_t end = range.end().offset();
        size_t startOfLine = caretLoc.offset() - (col - 1);
        size_t endOfLine = startOfLine + sourceLine.length();
        if (start < startOfLine)
            start = startOfLine;
        if (end > endOfLine)
            end = endOfLine;

        if (start >= end)
            return;

        // walk the range in to skip any leading or trailing whitespace
        start -= startOfLine;
        end -= startOfLine;
        while (sourceLine[start] == ' ' || sourceLine[start] == '\t') {
            start++;
            if (start == end)
                return;
        }
        while (sourceLine[end - 1] == ' ' || sourceLine[end - 1] == '\t') {
            end--;
            if (start == end)
                return;
        }

        size_t startCol = getColumnForByte(start);
        size_t endCol = getColumnForByte(end);
        SLANG_ASSERT(startCol <= endCol);

        if (highlightLine.size() < endCol)
            highlightLine.resize(endCol, ' ');

        std::ranges::fill(highlightLine.begin() + ptrdiff_t(startCol),
                          highlightLine.begin() + ptrdiff_t(endCol), '~');
    }